

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9VmUnsetMemObj(jx9_vm *pVm,sxu32 nObjIdx)

{
  void *pvVar1;
  sxi32 in_EAX;
  VmSlot sFree;
  sxu32 local_20 [2];
  undefined8 local_18;
  
  if ((nObjIdx < (pVm->aMemObj).nUsed) && (pvVar1 = (pVm->aMemObj).pBase, pvVar1 != (void *)0x0)) {
    jx9MemObjRelease((jx9_value *)((long)pvVar1 + (ulong)((pVm->aMemObj).eSize * nObjIdx)));
    local_18 = 0;
    local_20[0] = nObjIdx;
    in_EAX = SySetPut(&pVm->aFreeObj,local_20);
  }
  return in_EAX;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmUnsetMemObj(jx9_vm *pVm,sxu32 nObjIdx)
{
	jx9_value *pObj;
	pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nObjIdx);
	if( pObj ){
		VmSlot sFree;
		/* Release the object */
		jx9MemObjRelease(pObj);
		/* Restore to the free list */
		sFree.nIdx = nObjIdx;
		sFree.pUserData = 0;
		SySetPut(&pVm->aFreeObj, (const void *)&sFree);
	}				
	return SXRET_OK;
}